

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

void fe_sq_tl(fe *h,fe_loose *f)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  
  lVar35 = 0;
  do {
    if (0x1a666666666664 < f->v[lVar35]) {
      __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x1a666666666664UL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xf4,"void fe_sq_tl(fe *, const fe_loose *)");
    }
    lVar35 = lVar35 + 1;
  } while (lVar35 != 5);
  uVar36 = f->v[4];
  uVar39 = uVar36 * 0x26;
  uVar38 = f->v[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar36 * 0x13;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar36;
  uVar40 = f->v[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar38;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar39;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar38 * 0x13;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar38;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar40;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar39;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar40;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar38 * 0x26;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar40;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar40;
  uVar37 = f->v[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar37;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar39;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar37;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar38 * 2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar37;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar40 * 2;
  uVar39 = f->v[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar37;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar37;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar39;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar36 * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar39;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar38 * 2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar39;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar40 * 2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar39;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar37 * 2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar39;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar39;
  auVar5 = auVar15 * auVar30 + auVar7 * auVar22 + auVar5 * auVar20;
  uVar38 = auVar5._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar5._8_8_ << 0xd | uVar38 >> 0x33;
  auVar34 = auVar14 * auVar29 + auVar3 * auVar18 + auVar4 * auVar19 + auVar34;
  uVar40 = auVar34._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar34._8_8_ * 0x2000 | uVar40 >> 0x33;
  auVar33 = auVar13 * auVar28 + auVar2 * auVar17 + auVar10 * auVar25 + auVar33;
  uVar36 = auVar33._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar33._8_8_ * 0x2000 | uVar36 >> 0x33;
  auVar32 = auVar12 * auVar27 + auVar9 * auVar24 + auVar1 * auVar16 + auVar32;
  uVar39 = auVar32._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar32._8_8_ * 0x2000 | uVar39 >> 0x33;
  auVar31 = auVar11 * auVar26 + auVar8 * auVar23 + auVar6 * auVar21 + auVar31;
  uVar37 = auVar31._0_8_;
  uVar38 = (auVar31._8_8_ * 0x2000 | uVar37 >> 0x33) * 0x13 + (uVar38 & 0x7ffffffffffff);
  uVar40 = (uVar38 >> 0x33) + (uVar40 & 0x7ffffffffffff);
  h->v[0] = uVar38 & 0x7ffffffffffff;
  h->v[1] = uVar40 & 0x7ffffffffffff;
  h->v[2] = (uVar40 >> 0x33) + (uVar36 & 0x7ffffffffffff);
  h->v[3] = uVar39 & 0x7ffffffffffff;
  h->v[4] = uVar37 & 0x7ffffffffffff;
  lVar35 = 0;
  do {
    if (0x8cccccccccccc < h->v[lVar35]) {
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xf6,"void fe_sq_tl(fe *, const fe_loose *)");
    }
    lVar35 = lVar35 + 1;
  } while (lVar35 != 5);
  return;
}

Assistant:

static void fe_sq_tl(fe *h, const fe_loose *f) {
  assert_fe_loose(f->v);
  fiat_25519_carry_square(h->v, f->v);
  assert_fe(h->v);
}